

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addTagPattern(TestSpecParser *this)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 *in_RDI;
  TestSpecParser *in_stack_00000038;
  string token;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  unique_ptr<Catch::TestSpec::TagPattern> *puVar3;
  unique_ptr<Catch::TestSpec::TagPattern> *in_stack_ffffffffffffff58;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char (*in_stack_ffffffffffffffa8) [2];
  undefined8 local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  preprocessPattern_abi_cxx11_(in_stack_00000038);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::size();
    if ((1 < uVar1) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_28), *pcVar2 == '.')) {
      in_stack_ffffffffffffff70 = &local_28;
      std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::erase(in_stack_ffffffffffffff70,local_40);
      if ((*(byte *)(in_RDI + 2) & 1) == 0) {
        in_stack_ffffffffffffff60 =
             (vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
              *)(in_RDI + 0x26);
        Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        std::
        vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        Detail::unique_ptr<Catch::TestSpec::TagPattern>::~unique_ptr
                  ((unique_ptr<Catch::TestSpec::TagPattern> *)in_stack_ffffffffffffff50);
      }
      else {
        Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        std::
        vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        Detail::unique_ptr<Catch::TestSpec::TagPattern>::~unique_ptr
                  ((unique_ptr<Catch::TestSpec::TagPattern> *)in_stack_ffffffffffffff50);
      }
    }
    if ((*(byte *)(in_RDI + 2) & 1) == 0) {
      puVar3 = (unique_ptr<Catch::TestSpec::TagPattern> *)(in_RDI + 0x26);
      Detail::make_unique<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      Detail::unique_ptr<Catch::TestSpec::TagPattern>::~unique_ptr(puVar3);
    }
    else {
      puVar3 = (unique_ptr<Catch::TestSpec::TagPattern> *)(in_RDI + 0x2c);
      Detail::make_unique<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                (in_stack_ffffffffffffff60,puVar3);
      Detail::unique_ptr<Catch::TestSpec::TagPattern>::~unique_ptr
                ((unique_ptr<Catch::TestSpec::TagPattern> *)in_stack_ffffffffffffff50);
    }
  }
  std::__cxx11::string::clear();
  *(undefined1 *)(in_RDI + 2) = 0;
  *in_RDI = 0;
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void TestSpecParser::addTagPattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            // If the tag pattern is the "hide and tag" shorthand (e.g. [.foo])
            // we have to create a separate hide tag and shorten the real one
            if (token.size() > 1 && token[0] == '.') {
                token.erase(token.begin());
                if (m_exclusion) {
                    m_currentFilter.m_forbidden.emplace_back(Detail::make_unique<TestSpec::TagPattern>(".", m_substring));
                } else {
                    m_currentFilter.m_required.emplace_back(Detail::make_unique<TestSpec::TagPattern>(".", m_substring));
                }
            }
            if (m_exclusion) {
                m_currentFilter.m_forbidden.emplace_back(Detail::make_unique<TestSpec::TagPattern>(token, m_substring));
            } else {
                m_currentFilter.m_required.emplace_back(Detail::make_unique<TestSpec::TagPattern>(token, m_substring));
            }
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }